

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O2

bool __thiscall
glslang::TIntermediate::areAllChildConst(TIntermediate *this,TIntermAggregate *aggrNode)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  long lVar3;
  undefined8 *puVar4;
  bool bVar5;
  
  if (aggrNode == (TIntermAggregate *)0x0) {
    bVar5 = true;
  }
  else {
    iVar1 = (*(aggrNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])(aggrNode);
    puVar4 = *(undefined8 **)(CONCAT44(extraout_var,iVar1) + 8);
    do {
      bVar5 = puVar4 == *(undefined8 **)(CONCAT44(extraout_var,iVar1) + 0x10);
      if (bVar5) {
        return bVar5;
      }
      plVar2 = (long *)(**(code **)(*(long *)*puVar4 + 0x18))();
      lVar3 = (**(code **)(*plVar2 + 0x28))(plVar2);
      puVar4 = puVar4 + 1;
    } while (lVar3 != 0);
  }
  return bVar5;
}

Assistant:

bool TIntermediate::areAllChildConst(TIntermAggregate* aggrNode)
{
    bool allConstant = true;

    // check if all the child nodes are constants so that they can be inserted into
    // the parent node
    if (aggrNode) {
        TIntermSequence& childSequenceVector = aggrNode->getSequence();
        for (TIntermSequence::iterator p  = childSequenceVector.begin();
                                       p != childSequenceVector.end(); p++) {
            if (!(*p)->getAsTyped()->getAsConstantUnion())
                return false;
        }
    }

    return allConstant;
}